

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_base.cpp
# Opt level: O1

void Cmd_snd_listmididevices(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = "";
  pcVar2 = "";
  if (snd_mididevice.Value == -6) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-6. WildMidi\n",pcVar2);
  pcVar2 = "";
  if (snd_mididevice.Value == -5) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-5. FluidSynth\n",pcVar2);
  pcVar2 = "";
  if (snd_mididevice.Value == -4) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-4. Gravis Ultrasound Emulation\n",pcVar2);
  pcVar2 = "";
  if (snd_mididevice.Value == -3) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-3. Emulated OPL FM Synth\n",pcVar2);
  pcVar2 = "";
  if (snd_mididevice.Value == -2) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-2. TiMidity++\n",pcVar2);
  if (snd_mididevice.Value == -1) {
    pcVar1 = "\x1c+";
  }
  Printf("%s-1. Sound System\n",pcVar1);
  return;
}

Assistant:

CCMD (snd_listmididevices)
{
	Printf("%s-6. WildMidi\n", -6 == snd_mididevice ? TEXTCOLOR_BOLD : "");
#ifdef HAVE_FLUIDSYNTH
	Printf("%s-5. FluidSynth\n", -5 == snd_mididevice ? TEXTCOLOR_BOLD : "");
#endif
	Printf("%s-4. Gravis Ultrasound Emulation\n", -4 == snd_mididevice ? TEXTCOLOR_BOLD : "");
	Printf("%s-3. Emulated OPL FM Synth\n", -3 == snd_mididevice ? TEXTCOLOR_BOLD : "");
	Printf("%s-2. TiMidity++\n", -2 == snd_mididevice ? TEXTCOLOR_BOLD : "");
	Printf("%s-1. Sound System\n", -1 == snd_mididevice ? TEXTCOLOR_BOLD : "");
}